

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMathBuiltin
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  AsmJsFunc *pAVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ArgSlot AVar7;
  BOOL BVar8;
  Types TVar9;
  RegSlot RVar10;
  AsmJsType AVar11;
  uint uVar12;
  EmitExpressionInfo EVar13;
  ParseNodeCall *pPVar14;
  HeapAllocator *pHVar15;
  undefined4 *puVar16;
  AsmJsType *__s;
  EmitExpressionInfo *pEVar17;
  ParseNodeBin *pPVar18;
  ParseNodeFloat *pPVar19;
  RegisterSpace *pRVar20;
  ParseNodeUni *pPVar21;
  ParseNodeInt *pPVar22;
  RegSlot *pRVar23;
  AsmJsCompilationException *pAVar24;
  int32 i32y;
  EmitExpressionInfo *pEVar25;
  AsmJsMathFunction *pAVar26;
  ulong uVar27;
  long lVar28;
  DictionaryStats *this_00;
  ulong uVar29;
  EmitExpressionInfo EVar30;
  uint *puVar31;
  uint uVar32;
  ParseNode *pPVar33;
  ParseNodePtr pPVar34;
  float fVar35;
  undefined1 local_b0 [8];
  AsmJsRetType retType;
  AsmJsRetType local_84;
  AsmJsMathFunction *local_80;
  AutoArrayPtr<Js::AsmJsType> local_78;
  AsmJsType local_64;
  ParseNode *local_60;
  AutoArrayPtr<Js::EmitExpressionInfo> local_58;
  OpCodeAsmJs local_42;
  char cStack_40;
  undefined7 uStack_3f;
  OpCodeAsmJs op;
  EmitExpressionInfo local_38;
  
  if ((mathFunction->mBuiltIn & ~AsmJSMathBuiltin_cos) == AsmJSMathBuiltin_min) {
    EVar13 = EmitMinMax(this,pnode,mathFunction);
    pAVar26 = (AsmJsMathFunction *)((ulong)EVar13 >> 0x20);
    goto LAB_0094bbec;
  }
  pPVar14 = ParseNode::AsParseNodeCall(pnode);
  uVar29 = (ulong)pPVar14->argCount;
  local_60 = pnode;
  pPVar14 = ParseNode::AsParseNodeCall(pnode);
  pPVar33 = pPVar14->pnodeArgs;
  local_80 = mathFunction;
  bVar4 = AsmJsMathFunction::IsFround(&mathFunction->super_AsmJsFunctionDeclaration);
  _cStack_40 = (ByteCodeWriter *)CONCAT71(uStack_3f,!bVar4);
  if (pPVar33 != (ParseNode *)0x0 && (uVar29 == 1 && bVar4)) {
    if ((pPVar33->nop == knopInt) || (pPVar33->nop == knopFlt)) {
LAB_0094b792:
      ByteCodeWriter::StartStatement(&(this->mWriter).super_ByteCodeWriter,local_60,0);
      pAVar1 = this->mFunction;
      TVar9 = WAsmJs::FromPrimitiveType<float>();
      pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar1->mTypedRegisterAllocator,TVar9);
      RVar10 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar20);
      EVar13.type.which_ = Int;
      EVar13.super_EmitInfoBase.location = RVar10;
      if (pPVar33->nop == knopInt) {
        pPVar22 = ParseNode::AsParseNodeInt(pPVar33);
        fVar35 = (float)pPVar22->lw;
      }
      else if (pPVar33->nop == knopFlt) {
        pPVar19 = ParseNode::AsParseNodeFloat(pPVar33);
        fVar35 = (float)pPVar19->dbl;
      }
      else {
        if ((pPVar33->nop == knopNeg) &&
           (pPVar21 = ParseNode::AsParseNodeUni(pPVar33), pPVar21->pnode1->nop == knopInt)) {
          pPVar21 = ParseNode::AsParseNodeUni(pPVar33);
          pPVar22 = ParseNode::AsParseNodeInt(pPVar21->pnode1);
          if (pPVar22->lw != 0) goto LAB_0094baa3;
        }
        else {
LAB_0094baa3:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar16 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x4a1,"(ParserWrapper::IsNegativeZero(argNode))",
                                      "ParserWrapper::IsNegativeZero(argNode)");
          if (!bVar4) goto LAB_0094bc95;
          *puVar16 = 0;
        }
        fVar35 = -0.0;
      }
      _cStack_40 = (ByteCodeWriter *)CONCAT44(uStack_3f._3_4_,fVar35);
      pAVar1 = this->mFunction;
      local_38 = (EmitExpressionInfo)&this->mWriter;
      TVar9 = WAsmJs::FromPrimitiveType<float>();
      pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&pAVar1->mTypedRegisterAllocator,TVar9);
      lVar2 = *(long *)&pRVar20[1].mFirstTmpReg;
      uVar12 = 0;
      if (lVar2 != 0) {
        uVar12 = JsUtil::
                 BaseDictionary<float,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::AsmJsComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((int)(long)_cStack_40 * 2 + 1,pRVar20[2].mNbConst,
                             pRVar20[3].mNextLocation);
        uVar32 = *(uint *)(lVar2 + (ulong)uVar12 * 4);
        uVar12 = 0;
        if (-1 < (int)uVar32) {
          uVar12 = 0;
          do {
            if ((float)*(int *)(*(long *)&pRVar20[1].mNbConst + 8 + (ulong)uVar32 * 0xc) ==
                _cStack_40) {
              this_00 = *(DictionaryStats **)&pRVar20[3].mNbConst;
              goto LAB_0094bb98;
            }
            uVar12 = uVar12 + 1;
            uVar32 = *(uint *)(*(long *)&pRVar20[1].mNbConst + (ulong)uVar32 * 0xc + 4);
          } while (-1 < (int)uVar32);
        }
      }
      this_00 = *(DictionaryStats **)&pRVar20[3].mNbConst;
      uVar32 = 0xffffffff;
LAB_0094bb98:
      if (this_00 != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this_00,uVar12);
      }
      EVar30 = local_38;
      pPVar33 = local_60;
      if ((int)uVar32 < 0) {
        pRVar23 = &Constants::NoRegister;
      }
      else {
        pRVar23 = (RegSlot *)((ulong)uVar32 * 0xc + *(long *)&pRVar20[1].mNbConst);
      }
      AsmJsByteCodeWriter::AsmReg2((AsmJsByteCodeWriter *)local_38,Ld_Flt,RVar10,*pRVar23);
      ByteCodeWriter::EndStatement((ByteCodeWriter *)EVar30,pPVar33);
      pAVar26 = (AsmJsMathFunction *)0x3;
      goto LAB_0094bbec;
    }
    if ((pPVar33->nop == knopNeg) &&
       (pPVar21 = ParseNode::AsParseNodeUni(pPVar33), pPVar21->pnode1->nop == knopInt)) {
      pPVar21 = ParseNode::AsParseNodeUni(pPVar33);
      pPVar22 = ParseNode::AsParseNodeInt(pPVar21->pnode1);
      if (pPVar22->lw == 0) goto LAB_0094b792;
    }
  }
  local_78.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
  local_78.m_elementCount = 0;
  local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = (EmitExpressionInfo *)0x0;
  local_58.m_elementCount = 0;
  local_38 = (EmitExpressionInfo)uVar29;
  if (uVar29 != 0) {
    local_b0 = (undefined1  [8])&AsmJsType::typeinfo;
    _retType = 0;
    pHVar15 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0094bc95;
      *puVar16 = 0;
    }
    uVar29 = (ulong)((RegSlot)local_38.super_EmitInfoBase.location * 4);
    __s = (AsmJsType *)Memory::HeapAllocator::AllocT<false>(pHVar15,uVar29);
    if (__s == (AsmJsType *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_0094bc95;
      *puVar16 = 0;
    }
    memset(__s,0xff,uVar29);
    if (local_78.super_BasePtr<Js::AsmJsType>.ptr != (AsmJsType *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,Js::AsmJsType>
                (&Memory::HeapAllocator::Instance,local_78.m_elementCount,
                 local_78.super_BasePtr<Js::AsmJsType>.ptr);
    }
    local_78.m_elementCount._0_4_ = local_38.super_EmitInfoBase.location;
    local_78.m_elementCount._4_4_ = local_38.type.which_;
    local_b0 = (undefined1  [8])&EmitExpressionInfo::typeinfo;
    _retType = 0;
    local_78.super_BasePtr<Js::AsmJsType>.ptr = __s;
    pHVar15 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_0094bc95;
      *puVar16 = 0;
    }
    pEVar17 = (EmitExpressionInfo *)
              Memory::HeapAllocator::AllocT<false>
                        (pHVar15,(ulong)((RegSlot)local_38.super_EmitInfoBase.location * 8));
    if (pEVar17 == (EmitExpressionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_0094bc95;
      *puVar16 = 0;
    }
    pEVar25 = pEVar17;
    do {
      pEVar25->super_EmitInfoBase = 0xffffffff;
      pEVar25->type = Void;
      pEVar25 = pEVar25 + 1;
    } while (pEVar25 != pEVar17 + (long)local_38);
    if (local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr != (EmitExpressionInfo *)0x0) {
      Memory::DeleteArray<Memory::HeapAllocator,Js::EmitExpressionInfo>
                (&Memory::HeapAllocator::Instance,local_58.m_elementCount,
                 local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr);
    }
    local_58.m_elementCount._0_4_ = local_38.super_EmitInfoBase.location;
    local_58.m_elementCount._4_4_ = local_38.type.which_;
    uVar29 = 1;
    if (1 < (ushort)local_38.super_EmitInfoBase.location) {
      uVar29 = (ulong)local_38 & 0xffffffff;
    }
    uVar27 = 0;
    local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr = pEVar17;
    do {
      pPVar34 = pPVar33;
      if (pPVar33->nop == knopCall && cStack_40 == '\0') {
        AsmJsRetType::AsmJsRetType(&local_84,Float);
        EVar13 = EmitCall(this,pPVar33,local_84);
      }
      else {
        if (pPVar33->nop == knopList) {
          pPVar18 = ParseNode::AsParseNodeBin(pPVar33);
          pPVar34 = pPVar18->pnode1;
          pPVar18 = ParseNode::AsParseNodeBin(pPVar33);
          pPVar33 = pPVar34;
          pPVar34 = pPVar18->pnode2;
        }
        EVar13 = Emit(this,pPVar33);
      }
      local_78.super_BasePtr<Js::AsmJsType>.ptr[uVar27].which_ = EVar13.type.which_.which_;
      local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[uVar27].type.which_ =
           EVar13.type.which_.which_;
      local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[uVar27].super_EmitInfoBase.location =
           EVar13.super_EmitInfoBase.location.location;
      uVar27 = uVar27 + 1;
      pPVar33 = pPVar34;
    } while (uVar29 != uVar27);
  }
  _cStack_40 = &(this->mWriter).super_ByteCodeWriter;
  ByteCodeWriter::StartStatement(_cStack_40,local_60,0);
  AsmJsRetType::AsmJsRetType((AsmJsRetType *)local_b0);
  EVar13 = local_38;
  AVar7 = (ArgSlot)local_38.super_EmitInfoBase.location;
  bVar4 = AsmJsMathFunction::SupportsMathCall
                    (local_80,AVar7,local_78.super_BasePtr<Js::AsmJsType>.ptr,&local_42,
                     (AsmJsRetType *)local_b0);
  if (!bVar4) {
    pAVar24 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar24,L"Math builtin function doesn\'t support arguments");
    __cxa_throw(pAVar24,&AsmJsCompilationException::typeinfo,0);
  }
  lVar28 = (long)EVar13 + 1;
  lVar2 = (long)EVar13 * 8;
  while( true ) {
    if (lVar28 + -1 == 0 || lVar28 < 1) break;
    AsmJsFunc::ReleaseLocationGeneric
              (this->mFunction,
               (EmitExpressionInfo *)
               ((long)&local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[-1].super_EmitInfoBase.
                       location + lVar2));
    lVar28 = lVar28 + -1;
    lVar2 = lVar2 + -8;
  }
  AVar7 = AsmJsFunctionDeclaration::GetArgByteSize(&local_80->super_AsmJsFunctionDeclaration,AVar7);
  AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(AVar7 + 8 >> 3) + 2);
  local_64 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
  bVar4 = AsmJsType::isInt(&local_64);
  local_64 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
  bVar5 = AsmJsType::isFloatish(&local_64);
  if (!bVar4 && !bVar5) {
    local_64 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    bVar6 = AsmJsType::isDouble(&local_64);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                  ,0x4e5,"(isInt || isFloatish || retType.toType().isDouble())",
                                  "isInt || isFloatish || retType.toType().isDouble()");
      if (!bVar6) goto LAB_0094bc95;
      *puVar16 = 0;
    }
  }
  pAVar1 = this->mFunction;
  if (bVar4) {
    TVar9 = WAsmJs::FromPrimitiveType<int>();
  }
  else if (bVar5) {
    TVar9 = WAsmJs::FromPrimitiveType<float>();
  }
  else {
    TVar9 = WAsmJs::FromPrimitiveType<double>();
  }
  EVar13 = local_38;
  pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar1->mTypedRegisterAllocator,TVar9)
  ;
  RVar10 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar20);
  EVar30.type.which_ = Int;
  EVar30.super_EmitInfoBase.location = RVar10;
  AVar11 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
  if (EVar13 == (EmitExpressionInfo)0x1) {
    AsmJsByteCodeWriter::AsmReg2
              ((AsmJsByteCodeWriter *)_cStack_40,local_42,RVar10,
               ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location);
  }
  else if ((RegSlot)EVar13.super_EmitInfoBase.location == 2) {
    AsmJsByteCodeWriter::AsmReg3
              ((AsmJsByteCodeWriter *)_cStack_40,local_42,RVar10,
               ((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->super_EmitInfoBase).location,
               local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr[1].super_EmitInfoBase.location);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x500,"((0))","(0)");
    if (!bVar4) {
LAB_0094bc95:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar16 = 0;
  }
  local_80 = (AsmJsMathFunction *)(ulong)AVar11.which_;
  local_38 = EVar30;
  if (EVar13 != (EmitExpressionInfo)0x0) {
    uVar29 = 0;
    do {
      bVar4 = AsmJsType::isSubType
                        ((AsmJsType *)
                         ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).which_
                         + uVar29),(AsmJsType)0x7);
      if (bVar4) {
        pAVar1 = this->mFunction;
        puVar31 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                  super_EmitInfoBase).location + uVar29);
        TVar9 = WAsmJs::FromPrimitiveType<float>();
        pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                            (&pAVar1->mTypedRegisterAllocator,TVar9);
        if (((puVar31 == (uint *)0x0) || (uVar32 = *puVar31, uVar32 == 0xffffffff)) ||
           (pRVar20->mRegisterCount <= uVar32)) {
          pAVar24 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar24,L"Invalid Node location[%d] ",
                     (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                             super_EmitInfoBase).location + uVar29));
LAB_0094bc84:
          __cxa_throw(pAVar24,&AsmJsCompilationException::typeinfo,0);
        }
      }
      else {
        bVar4 = AsmJsType::isSubType
                          ((AsmJsType *)
                           ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                   which_ + uVar29),(AsmJsType)0x4);
        if (bVar4) {
          pAVar1 = this->mFunction;
          puVar31 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                    super_EmitInfoBase).location + uVar29);
          TVar9 = WAsmJs::FromPrimitiveType<double>();
          pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                              (&pAVar1->mTypedRegisterAllocator,TVar9);
          if (((puVar31 == (uint *)0x0) || (uVar32 = *puVar31, uVar32 == 0xffffffff)) ||
             (pRVar20->mRegisterCount <= uVar32)) {
            pAVar24 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar24,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)
                                               ->super_EmitInfoBase).location + uVar29));
            goto LAB_0094bc84;
          }
        }
        else {
          bVar4 = AsmJsType::isSubType
                            ((AsmJsType *)
                             ((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->type).
                                     which_ + uVar29),(AsmJsType)0xc);
          if (bVar4) {
            pAVar1 = this->mFunction;
            puVar31 = (uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.ptr)->
                                      super_EmitInfoBase).location + uVar29);
            TVar9 = WAsmJs::FromPrimitiveType<int>();
            pRVar20 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                                (&pAVar1->mTypedRegisterAllocator,TVar9);
            if (((puVar31 == (uint *)0x0) || (uVar32 = *puVar31, uVar32 == 0xffffffff)) ||
               (pRVar20->mRegisterCount <= uVar32)) {
              pAVar24 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
              AsmJsCompilationException::AsmJsCompilationException
                        (pAVar24,L"Invalid Node location[%d] ",
                         (ulong)*(uint *)((long)&((local_58.super_BasePtr<Js::EmitExpressionInfo>.
                                                  ptr)->super_EmitInfoBase).location + uVar29));
              goto LAB_0094bc84;
            }
          }
        }
      }
      uVar29 = uVar29 + 8;
    } while ((RegSlot)EVar13.super_EmitInfoBase.location << 3 != uVar29);
  }
  ByteCodeWriter::EndStatement(_cStack_40,local_60);
  EVar13 = local_38;
  pAVar26 = local_80;
  AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr(&local_58);
  AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr(&local_78);
LAB_0094bbec:
  return (EmitExpressionInfo)((ulong)EVar13 & 0xffffffff | (long)pAVar26 << 0x20);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMathBuiltin(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        if (mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_max || mathFunction->GetMathBuiltInFunction() == AsmJSMathBuiltinFunction::AsmJSMathBuiltin_min)
        {
            return EmitMinMax(pnode, mathFunction);
        }

        const ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;
        const bool isFRound = AsmJsMathFunction::IsFround(mathFunction);

        // for fround, if we have a fround(NumericLiteral), we want to just emit Ld_Flt NumericLiteral
        if (argCount == 1 && isFRound && ParserWrapper::IsFroundNumericLiteral(argNode))
        {
            StartStatement(pnode);
            RegSlot dst = mFunction->AcquireTmpRegister<float>();
            EmitExpressionInfo emitInfo(dst, AsmJsType::Float);
            float constValue = -0.0f;
            if (argNode->nop == knopFlt)
            {
                constValue = (float)argNode->AsParseNodeFloat()->dbl;
            }
            else if (argNode->nop == knopInt)
            {
                constValue = (float)argNode->AsParseNodeInt()->lw;
            }
            else
            {
                Assert(ParserWrapper::IsNegativeZero(argNode));
            }
            mWriter.AsmReg2(OpCodeAsmJs::Ld_Flt, dst, mFunction->GetConstRegister<float>(constValue));
            EndStatement(pnode);
            return emitInfo;
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        if( argCount > 0 )
        {
            types.Set(HeapNewArray(AsmJsType, argCount), argCount);
            argsInfo.Set(HeapNewArray(EmitExpressionInfo, argCount), argCount);

            for(ArgSlot i = 0; i < argCount; i++)
            {
                // Get i arg node
                ParseNode* arg = argNode;
                // Special case for fround(abs()) call
                if (argNode->nop == knopCall && isFRound)
                {
                    // Emit argument
                    const EmitExpressionInfo& argInfo = EmitCall(arg, AsmJsRetType::Float);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
                else
                {
                    if (argNode->nop == knopList)
                    {
                        arg = ParserWrapper::GetBinaryLeft(argNode);
                        argNode = ParserWrapper::GetBinaryRight(argNode);
                    }
                    // Emit argument
                    const EmitExpressionInfo& argInfo = Emit(arg);
                    types[i] = argInfo.type;
                    argsInfo[i].type = argInfo.type;
                    argsInfo[i].location = argInfo.location;
                }
            }
        }
        StartStatement(pnode);
        // Check if this function supports the type of these arguments
        AsmJsRetType retType;
        OpCodeAsmJs op;
        const bool supported = mathFunction->SupportsMathCall( argCount, types, op, retType );
        if( !supported )
        {
            throw AsmJsCompilationException( _u("Math builtin function doesn't support arguments") );
        }

        // Release all used location before acquiring a new tmp register
        for (int i = argCount - 1; i >= 0 ; i--)
        {
            mFunction->ReleaseLocationGeneric( &argsInfo[i] );
        }

        const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
        // + 1 is for function object
        int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;

        // Make sure we have enough memory allocated for OutParameters
        // + 1 for return address
        mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);

        const bool isInt = retType.toType().isInt();
        const bool isFloatish = retType.toType().isFloatish();
        Assert(isInt || isFloatish || retType.toType().isDouble());

        RegSlot dst;
        if( isInt )
        {
            dst = mFunction->AcquireTmpRegister<int>();
        }
        else if (isFloatish)
        {
            dst = mFunction->AcquireTmpRegister<float>();
        }
        else
        {
            dst = mFunction->AcquireTmpRegister<double>();
        }

        EmitExpressionInfo emitInfo(dst, retType.toType());

        switch( argCount )
        {
        case 1:
            mWriter.AsmReg2( op, dst, argsInfo[0].location );
            break;
        case 2:
            mWriter.AsmReg3( op, dst, argsInfo[0].location, argsInfo[1].location );
            break;
        default:
            Assume(UNREACHED);
        }
#if DBG
        for (int i = 0; i < argCount; i++)
        {
            if (argsInfo[i].type.isSubType(AsmJsType::Floatish))
            {
                CheckNodeLocation(argsInfo[i], float);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::MaybeDouble))
            {
                CheckNodeLocation(argsInfo[i], double);
            }
            else if (argsInfo[i].type.isSubType(AsmJsType::Intish))
            {
                CheckNodeLocation(argsInfo[i], int);
            }
        }
#endif
        EndStatement(pnode);
        return emitInfo;
    }